

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::
basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>_>::
write_decimal<int>(basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>_>
                   *this,int value)

{
  basic_buffer<fmt::v5::char8_t> *pbVar1;
  size_t sVar2;
  undefined1 *puVar3;
  byte bVar4;
  long lVar5;
  uint uVar6;
  ulong __n;
  uint uVar7;
  ulong uVar8;
  char8_t *__dest;
  ulong uVar9;
  char_type buffer [13];
  undefined1 local_3d [13];
  
  uVar8 = (ulong)(uint)-value;
  if (0 < value) {
    uVar8 = (ulong)(uint)value;
  }
  uVar7 = (uint)uVar8;
  uVar6 = 0x1f;
  if ((uVar7 | 1) != 0) {
    for (; (uVar7 | 1) >> uVar6 == 0; uVar6 = uVar6 - 1) {
    }
  }
  uVar6 = (uVar6 ^ 0xffffffe0) * 0x4d1 + 0x9ef1 >> 0xc;
  __n = (ulong)((uVar6 - (uVar7 < *(uint *)(internal::basic_data<void>::ZERO_OR_POWERS_OF_10_32 +
                                           (ulong)uVar6 * 4))) + 1);
  pbVar1 = (this->out_).container;
  sVar2 = pbVar1->size_;
  uVar9 = ((uint)value >> 0x1f) + sVar2 + __n;
  if (pbVar1->capacity_ < uVar9) {
    (**pbVar1->_vptr_basic_buffer)(pbVar1,uVar9);
  }
  __dest = pbVar1->ptr_ + sVar2;
  pbVar1->size_ = uVar9;
  if (value < 0) {
    *__dest = 0x2d;
    __dest = __dest + 1;
  }
  puVar3 = local_3d + __n;
  if (99 < uVar7) {
    do {
      uVar6 = (uint)uVar8;
      uVar7 = (uint)(uVar8 / 100);
      uVar8 = uVar8 / 100;
      *(undefined2 *)(puVar3 + -2) =
           *(undefined2 *)
            (internal::basic_data<void>::DIGITS + (ulong)(uVar6 + (int)uVar8 * -100) * 2);
      puVar3 = puVar3 + -2;
    } while (9999 < uVar6);
  }
  if (uVar7 < 10) {
    bVar4 = (byte)uVar7 | 0x30;
    lVar5 = -1;
  }
  else {
    puVar3[-1] = internal::basic_data<void>::DIGITS[((ulong)uVar7 * 2 & 0xffffffff) + 1];
    bVar4 = internal::basic_data<void>::DIGITS[(ulong)uVar7 * 2];
    lVar5 = -2;
  }
  puVar3[lVar5] = bVar4;
  if (__n != 0) {
    memcpy(__dest,local_3d,__n);
  }
  return;
}

Assistant:

void write_decimal(Int value) {
    typedef typename internal::int_traits<Int>::main_type main_type;
    main_type abs_value = static_cast<main_type>(value);
    bool is_negative = internal::is_negative(value);
    if (is_negative)
      abs_value = 0 - abs_value;
    int num_digits = internal::count_digits(abs_value);
    auto &&it = reserve((is_negative ? 1 : 0) + static_cast<size_t>(num_digits));
    if (is_negative)
      *it++ = static_cast<char_type>('-');
    it = internal::format_decimal<char_type>(it, abs_value, num_digits);
  }